

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_reference_expression.cpp
# Opt level: O2

void __thiscall
duckdb::BoundReferenceExpression::BoundReferenceExpression
          (BoundReferenceExpression *this,LogicalType *type,storage_t index)

{
  LogicalType local_50;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&local_50,type);
  BoundReferenceExpression(this,&local_38,&local_50,index);
  LogicalType::~LogicalType(&local_50);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

BoundReferenceExpression::BoundReferenceExpression(LogicalType type, storage_t index)
    : BoundReferenceExpression(string(), std::move(type), index) {
}